

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O2

void __thiscall amrex::ForkJoin::copy_data_to_tasks(ForkJoin *this)

{
  _Hash_node_base *p_Var1;
  FabArray<amrex::FArrayBox> *pFVar2;
  BoxArray *__args;
  ostream *poVar3;
  _Hash_node_base *p_Var4;
  DistributionMapping *__args_1;
  Print *pPVar5;
  _Hash_node_base *p_Var6;
  char *pcVar7;
  long lVar8;
  ostringstream *poVar9;
  IntVect *__args_3;
  int task_idx;
  ulong uVar10;
  int task_comp_n;
  long local_1f0;
  string *local_1e8;
  vector<amrex::MultiFab,std::allocator<amrex::MultiFab>> *local_1e0;
  __node_base *local_1d8;
  DistributionMapping *local_1d0;
  BoxArray *local_1c8;
  FabArray<amrex::FArrayBox> *local_1c0;
  Print local_1b8;
  
  if (this->flag_verbose == true) {
    poVar3 = OutStream();
    Print::Print(&local_1b8,poVar3);
    std::operator<<((ostream *)&local_1b8.ss,"Copying data into fork-join tasks ...\n");
    Print::~Print(&local_1b8);
  }
  local_1d8 = &(this->data)._M_h._M_before_begin;
  do {
    local_1d8 = local_1d8->_M_nxt;
    if (local_1d8 == (__node_base *)0x0) {
      return;
    }
    local_1e8 = (string *)(local_1d8 + 1);
    lVar8 = 0;
    while( true ) {
      p_Var1 = local_1d8[5]._M_nxt;
      if (((long)local_1d8[6]._M_nxt - (long)p_Var1) / 0x50 <= lVar8) break;
      local_1e0 = (vector<amrex::MultiFab,std::allocator<amrex::MultiFab>> *)
                  (p_Var1 + lVar8 * 10 + 7);
      pFVar2 = (FabArray<amrex::FArrayBox> *)p_Var1[lVar8 * 10]._M_nxt;
      local_1c8 = &(pFVar2->super_FabArrayBase).boxarray;
      local_1f0 = lVar8;
      std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::reserve
                ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)local_1e0,
                 ((long)(this->split_bounds).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->split_bounds).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start) * 0x40000000 + -0x100000000 >> 0x20);
      local_1d0 = &(pFVar2->super_FabArrayBase).distributionMap;
      __args_3 = (IntVect *)((long)&p_Var1[lVar8 * 10 + 2]._M_nxt + 4);
      local_1c0 = pFVar2;
      for (uVar10 = 0;
          (long)uVar10 <
          ((long)(this->split_bounds).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
          (long)(this->split_bounds).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start) * 0x40000000 + -0x100000000 >> 0x20; uVar10 = uVar10 + 1) {
        if (*(int *)&p_Var1[lVar8 * 10 + 1]._M_nxt == 0) {
          p_Var4 = p_Var1[lVar8 * 10 + 8]._M_nxt;
          p_Var6 = p_Var1[lVar8 * 10 + 7]._M_nxt;
          if (uVar10 == *(uint *)&p_Var1[lVar8 * 10 + 2]._M_nxt) goto LAB_004f9f88;
          if (((long)p_Var4 - (long)p_Var6) / 0x180 <= (long)uVar10) {
            MultiFab::MultiFab((MultiFab *)&local_1b8);
            std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::
            emplace_back<amrex::MultiFab>
                      ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)local_1e0,
                       (MultiFab *)&local_1b8);
            MultiFab::~MultiFab((MultiFab *)&local_1b8);
          }
        }
        else {
          p_Var6 = p_Var1[lVar8 * 10 + 7]._M_nxt;
          p_Var4 = p_Var1[lVar8 * 10 + 8]._M_nxt;
LAB_004f9f88:
          task_comp_n = *(int *)((long)&p_Var1[lVar8 * 10 + 4]._M_nxt[uVar10]._M_nxt + 4) -
                        *(int *)&p_Var1[lVar8 * 10 + 4]._M_nxt[uVar10]._M_nxt;
          task_idx = (int)uVar10;
          if ((long)uVar10 < ((long)p_Var4 - (long)p_Var6) / 0x180) {
            if (this->flag_verbose != false) {
              poVar3 = OutStream();
              Print::Print(&local_1b8,poVar3);
              poVar9 = &local_1b8.ss;
              std::operator<<((ostream *)poVar9,"  Forked ");
              std::operator<<((ostream *)poVar9,local_1e8);
              std::operator<<((ostream *)poVar9,"[");
              std::ostream::operator<<(poVar9,(int)local_1f0);
              std::operator<<((ostream *)poVar9,"] for task ");
              std::ostream::operator<<(poVar9,task_idx);
              std::operator<<((ostream *)poVar9," already created");
              std::endl<char,std::char_traits<char>>((ostream *)poVar9);
              Print::~Print(&local_1b8);
            }
          }
          else {
            if (this->flag_verbose != false) {
              poVar3 = OutStream();
              Print::Print(&local_1b8,poVar3);
              poVar9 = &local_1b8.ss;
              std::operator<<((ostream *)poVar9,"  Creating forked ");
              std::operator<<((ostream *)poVar9,local_1e8);
              std::operator<<((ostream *)poVar9,"[");
              std::ostream::operator<<(poVar9,(int)local_1f0);
              std::operator<<((ostream *)poVar9,"] for task ");
              std::ostream::operator<<(poVar9,task_idx);
              pcVar7 = " (whole)";
              if (*(int *)&p_Var1[lVar8 * 10 + 1]._M_nxt == 2) {
                pcVar7 = " (split)";
              }
              std::operator<<((ostream *)poVar9,pcVar7);
              std::endl<char,std::char_traits<char>>((ostream *)poVar9);
              Print::~Print(&local_1b8);
            }
            __args = local_1c8;
            __args_1 = get_dm(this,local_1c8,task_idx,local_1d0);
            std::vector<amrex::MultiFab,std::allocator<amrex::MultiFab>>::
            emplace_back<amrex::BoxArray_const&,amrex::DistributionMapping_const&,int&,amrex::IntVect&>
                      (local_1e0,__args,__args_1,&task_comp_n,__args_3);
          }
          if (((ulong)p_Var1[lVar8 * 10 + 1]._M_nxt & 0xfffffffd00000000) == 0) {
            if (this->flag_verbose == true) {
              poVar3 = OutStream();
              Print::Print(&local_1b8,poVar3);
              std::operator<<((ostream *)&local_1b8.ss,"    Copying ");
              std::operator<<((ostream *)&local_1b8.ss,local_1e8);
              std::operator<<((ostream *)&local_1b8.ss,"[");
              std::ostream::operator<<(&local_1b8.ss,(int)local_1f0);
              std::operator<<((ostream *)&local_1b8.ss,"] components [");
              pPVar5 = Print::operator<<(&local_1b8,(int *)(p_Var1[lVar8 * 10 + 4]._M_nxt + uVar10))
              ;
              std::operator<<((ostream *)&pPVar5->ss,", ");
              pPVar5 = Print::operator<<(pPVar5,(int *)((long)&p_Var1[lVar8 * 10 + 4]._M_nxt[uVar10]
                                                               ._M_nxt + 4));
              poVar9 = &pPVar5->ss;
              std::operator<<((ostream *)poVar9,") into to task ");
              std::ostream::operator<<(poVar9,task_idx);
              std::endl<char,std::char_traits<char>>((ostream *)poVar9);
              Print::~Print(&local_1b8);
            }
            FabArray<amrex::FArrayBox>::Redistribute
                      ((FabArray<amrex::FArrayBox> *)(p_Var1[lVar8 * 10 + 7]._M_nxt + uVar10 * 0x30)
                       ,local_1c0,*(int *)&p_Var1[lVar8 * 10 + 4]._M_nxt[uVar10]._M_nxt,0,
                       task_comp_n,__args_3);
          }
        }
      }
      lVar8 = local_1f0 + 1;
    }
  } while( true );
}

Assistant:

void
ForkJoin::copy_data_to_tasks ()
{
    BL_PROFILE("ForkJoin::copy_data_to_tasks()");
    if (flag_verbose) {
        amrex::Print() << "Copying data into fork-join tasks ...\n";
    }
    for (auto &p : data) { // for each name
        const auto &mf_name = p.first;
        for (int idx = 0; idx < p.second.size(); ++idx) { // for each index
            auto &mff = p.second[idx];
            const auto &orig = *mff.orig;
            const auto &ba = orig.boxArray();
            const auto &comp_split = mff.comp_split;
            auto &forked = mff.forked;

            forked.reserve(NTasks()); // does nothing if forked MFs already created
            for (int i = 0; i < NTasks(); ++i) {
                // check if this task needs this MF
                if (mff.strategy != Strategy::single || i == mff.owner_task) {
                    int task_comp_n = comp_split[i].hi - comp_split[i].lo;

                    // create task's MF if first time through
                    if (forked.size() <= i) {
                        if (flag_verbose) {
                            amrex::Print() << "  Creating forked " << mf_name << "[" << idx << "] for task " << i
                                           << (mff.strategy == Strategy::split ? " (split)" : " (whole)") << std::endl;
                        }
                        // look up the distribution mapping for this (box array, task) pair
                        const DistributionMapping &dm = get_dm(ba, i, orig.DistributionMap());
                        forked.emplace_back(ba, dm, task_comp_n, mff.ngrow);
                    } else if (flag_verbose) {
                        amrex::Print() << "  Forked " << mf_name << "[" << idx << "] for task " << i
                                       << " already created" << std::endl;
                    }
                    AMREX_ASSERT(i < forked.size());

                    // copy data if needed
                    if (mff.intent == Intent::in || mff.intent == Intent::inout) {
                        if (flag_verbose) {
                            amrex::Print() << "    Copying " << mf_name << "[" << idx << "] components ["
                                           << comp_split[i].lo << ", " << comp_split[i].hi << ") into to task " << i << std::endl;
                        }
                        // parallel copy data into forked MF
                        forked[i].Redistribute(orig, comp_split[i].lo, 0, task_comp_n, mff.ngrow);
                    }

                } else {
                    // this task doesn't use the MultiFab
                    if (forked.size() <= i) {
                        // first time through, push empty placeholder (not used)
                        forked.push_back(MultiFab());
                    }
                }
            }
            AMREX_ASSERT(forked.size() == NTasks());
        }
    }
}